

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O0

Ref<embree::Image> embree::loadEXR(FileName *fileName)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _func_int **pp_Var3;
  string *name;
  size_t height_00;
  ImageT<embree::Col4<float>_> *in_RDI;
  float *pix;
  ssize_t x;
  ssize_t y;
  int ret;
  char *err;
  int height;
  int width;
  float *rgba;
  Ref<embree::Image> *img;
  FileName *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  float **in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe70;
  ImageT<embree::Col4<float>_> *this;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 *local_150;
  long local_148;
  long local_140;
  undefined1 local_131;
  string local_130 [38];
  undefined1 local_10a;
  undefined1 local_109;
  string local_e8 [48];
  string local_b8 [36];
  int local_94;
  char *local_90;
  int local_88;
  int local_84;
  void *local_80;
  _func_int **local_68;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 *local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_90 = (char *)0x0;
  this = in_RDI;
  FileName::str_abi_cxx11_(in_stack_fffffffffffffe28);
  std::__cxx11::string::c_str();
  iVar1 = LoadEXR(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                  (char *)in_stack_fffffffffffffe28,(char **)0x45c96c);
  std::__cxx11::string::~string(local_b8);
  local_94 = iVar1;
  if (iVar1 == 0) {
    local_10a = 0;
    pp_Var3 = (_func_int **)::operator_new(0x48);
    local_131 = 1;
    name = (string *)(long)local_84;
    height_00 = (size_t)local_88;
    FileName::operator_cast_to_string(in_stack_fffffffffffffe28);
    ImageT<embree::Col4<float>_>::ImageT(this,in_stack_fffffffffffffe70,height_00,name);
    local_131 = 0;
    (this->super_Image).super_RefCount._vptr_RefCount = pp_Var3;
    local_68 = pp_Var3;
    if ((this->super_Image).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(this->super_Image).super_RefCount._vptr_RefCount + 0x10))();
    }
    std::__cxx11::string::~string(local_130);
    for (local_140 = 0; local_140 < local_88; local_140 = local_140 + 1) {
      for (local_148 = 0; local_148 < local_84; local_148 = local_148 + 1) {
        local_150 = (undefined8 *)((long)local_80 + (local_140 * local_84 + local_148) * 0x10);
        pp_Var3 = (this->super_Image).super_RefCount._vptr_RefCount;
        local_44 = *(undefined4 *)local_150;
        local_48 = *(undefined4 *)((long)local_150 + 4);
        local_28 = *local_150;
        local_4c = *(undefined4 *)(local_150 + 1);
        local_40 = &local_168;
        local_50 = 0x3f800000;
        local_4 = 0x3f800000;
        uStack_20 = CONCAT44(0x3f800000,local_4c);
        uStack_15c = 0x3f800000;
        local_10 = local_44;
        local_c = local_48;
        local_8 = local_4c;
        local_168 = local_44;
        uStack_164 = local_48;
        uStack_160 = local_4c;
        (**(code **)(*pp_Var3 + 0x28))(pp_Var3,local_148,local_140,&local_168);
      }
    }
    free(local_80);
    return (Ref<embree::Image>)&in_RDI->super_Image;
  }
  if (local_90 != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERR: ");
    std::operator<<(poVar2,local_90);
    FreeEXRErrorMessage((char *)0x45c9d3);
  }
  local_109 = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  FileName::str_abi_cxx11_(in_stack_fffffffffffffe28);
  std::operator+((char *)this,__rhs);
  std::runtime_error::runtime_error((runtime_error *)__rhs,local_e8);
  local_109 = 0;
  __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadEXR(const FileName& fileName)
  {
    float* rgba; // width * height * RGBA
    int width;
    int height;
    const char* err = NULL; // or nullptr in C++11

    int ret = LoadEXR(&rgba, &width, &height, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not load image " + fileName.str())
    }

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    for (ssize_t y=0; y<height; y++) {
      for (ssize_t x=0; x<width; x++) {
        float* pix = rgba + (y * width + x) * 4;
        img->set(x,y,Color4(pix[0],pix[1],pix[2],1.0f));
      }
    }
    free(rgba);
    return img;
  }